

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

bool __thiscall FIX::SocketMonitor::drop(SocketMonitor *this,socket_handle s)

{
  bool bVar1;
  bool local_51;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  iterator k;
  iterator j;
  iterator i;
  socket_handle s_local;
  SocketMonitor *this_local;
  
  i._M_node._4_4_ = s;
  j = std::set<int,_std::less<int>,_std::allocator<int>_>::find
                (&this->m_readSockets,(key_type *)((long)&i._M_node + 4));
  k = std::set<int,_std::less<int>,_std::allocator<int>_>::find
                (&this->m_writeSockets,(key_type *)((long)&i._M_node + 4));
  local_38._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&this->m_connectSockets,(key_type *)((long)&i._M_node + 4));
  local_40._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_readSockets);
  bVar1 = std::operator!=(&j,&local_40);
  local_51 = true;
  if (!bVar1) {
    local_48._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_writeSockets);
    bVar1 = std::operator!=(&k,&local_48);
    local_51 = true;
    if (!bVar1) {
      local_50._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_connectSockets);
      local_51 = std::operator!=(&local_38,&local_50);
    }
  }
  if (local_51 != false) {
    socket_close(i._M_node._4_4_);
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (&this->m_readSockets,(key_type *)((long)&i._M_node + 4));
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (&this->m_writeSockets,(key_type *)((long)&i._M_node + 4));
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (&this->m_connectSockets,(key_type *)((long)&i._M_node + 4));
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              (&this->m_dropped,(value_type *)((long)&i._M_node + 4));
  }
  return local_51 != false;
}

Assistant:

bool SocketMonitor::drop(socket_handle s) {
  Sockets::iterator i = m_readSockets.find(s);
  Sockets::iterator j = m_writeSockets.find(s);
  Sockets::iterator k = m_connectSockets.find(s);

  if (i != m_readSockets.end() || j != m_writeSockets.end() || k != m_connectSockets.end()) {
    socket_close(s);
    m_readSockets.erase(s);
    m_writeSockets.erase(s);
    m_connectSockets.erase(s);
    m_dropped.push(s);
    return true;
  }
  return false;
}